

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  byte bVar1;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  uint size;
  char *pcVar2;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  pair<const_char_*,_int> pVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (arena == (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
               ,0x10c);
    other = LogMessage::operator<<(&local_68,"CHECK failed: arena != nullptr: ");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_68);
  }
  bVar1 = *ptr;
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar3 = ReadSizeFallback(ptr,(uint)bVar1);
    pcVar2 = pVar3.first;
    size = pVar3.second;
  }
  else {
    pcVar2 = ptr + 1;
  }
  if (pcVar2 != (char *)0x0) {
    s_00 = Arena::Create<std::__cxx11::string>(arena);
    pcVar2 = ReadString(this,pcVar2,size,s_00);
    if (pcVar2 != (char *)0x0) {
      (s->tagged_ptr_).ptr_ = s_00;
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  GOOGLE_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = Arena::Create<std::string>(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);

  SetStrWithHeapBuffer(str, s);

  return ptr;
}